

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

void __thiscall
mjs::regexp_literal_expression::regexp_literal_expression
          (regexp_literal_expression *this,source_extend *extend,wstring_view pattern,
          wstring_view flags)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  uint32_t uVar2;
  regexp_flag flags_00;
  wstring_view s;
  
  s._M_str = (wchar_t *)pattern._M_len;
  (this->super_expression).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__syntax_node_001db118;
  (this->super_expression).super_syntax_node.extend_.file.
  super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->super_expression).super_syntax_node.extend_.file.
  super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  uVar2 = extend->end;
  (this->super_expression).super_syntax_node.extend_.start = extend->start;
  (this->super_expression).super_syntax_node.extend_.end = uVar2;
  (this->super_expression).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__regexp_literal_expression_001db430;
  s._M_len = (size_t)flags._M_str;
  flags_00 = regexp_flags_from_string((mjs *)flags._M_len,s);
  regexp::regexp(&this->re_,pattern,flags_00);
  return;
}

Assistant:

explicit regexp_literal_expression(const source_extend& extend, std::wstring_view pattern, std::wstring_view flags) : expression(extend), re_(pattern, flags) {
    }